

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  int *piVar1;
  Wal **ppWVar2;
  int iVar3;
  Btree *p;
  sqlite3_file *psVar4;
  uint uVar5;
  int iVar6;
  Pager *pPVar7;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zDbName == (char *)0x0) {
    uVar5 = 0;
LAB_001432c7:
    p = db->aDb[uVar5].pBt;
    if (p != (Btree *)0x0) {
      if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
        btreeLockCarefully(p);
      }
      pPVar7 = p->pBt->pPager;
      psVar4 = pPVar7->fd;
      if (op < 0x1c) {
        if (op != 7) {
          if (op != 0x1b) {
LAB_00143351:
            iVar3 = (db->busyHandler).nBusy;
            if (psVar4->pMethods == (sqlite3_io_methods *)0x0) {
              iVar6 = 0xc;
            }
            else {
              iVar6 = (*psVar4->pMethods->xFileControl)(psVar4,op,pArg);
            }
            (db->busyHandler).nBusy = iVar3;
            goto LAB_0014339a;
          }
          goto LAB_00143382;
        }
        *(sqlite3_file **)pArg = psVar4;
LAB_00143398:
        iVar6 = 0;
      }
      else {
        if (op == 0x1c) {
          ppWVar2 = &pPVar7->pWal;
          pPVar7 = (Pager *)&pPVar7->jfd;
          if (*ppWVar2 != (Wal *)0x0) {
            pPVar7 = (Pager *)&(*ppWVar2)->pWalFd;
          }
LAB_00143382:
          *(sqlite3_vfs **)pArg = pPVar7->pVfs;
          goto LAB_00143398;
        }
        if (op == 0x23) {
          *(u32 *)pArg = pPVar7->iDataVersion;
          goto LAB_00143398;
        }
        if (op != 0x26) goto LAB_00143351;
        uVar5 = *pArg;
        iVar6 = sqlite3BtreeGetRequestedReserve(p);
        *(int *)pArg = iVar6;
        iVar6 = 0;
        if (uVar5 < 0x100) {
          iVar6 = 0;
          sqlite3BtreeSetPageSize(p,0,uVar5,0);
        }
      }
LAB_0014339a:
      if (p->sharable != '\0') {
        piVar1 = &p->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(p);
        }
      }
      goto LAB_001433af;
    }
  }
  else {
    uVar5 = sqlite3FindDbName(db,zDbName);
    if (-1 < (int)uVar5) goto LAB_001432c7;
  }
  iVar6 = 1;
LAB_001433af:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}